

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O0

void __thiscall xmrig::OclBackend::printHashrate(OclBackend *this,bool details)

{
  int64_t iVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  Hashrate *this_00;
  char *pcVar6;
  int __c;
  byte in_SIL;
  long *in_RDI;
  OclLaunchData *data;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *__range1;
  size_t i;
  char num [24];
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  String *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff18;
  Hashrate *in_stack_ffffffffffffff20;
  PciTopology *in_stack_ffffffffffffff28;
  OclDevice *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  Hashrate *in_stack_ffffffffffffff68;
  String local_80 [2];
  Hashrate local_60;
  long local_30;
  undefined1 local_28 [31];
  byte local_9;
  
  local_9 = in_SIL & 1;
  if ((local_9 != 0) && (lVar3 = (**(code **)(*in_RDI + 0x20))(), lVar3 != 0)) {
    memset(local_28,0,0x18);
    Log::print("\x1b[1;37m| OPENCL # | AFFINITY | 10s H/s | 60s H/s | 15m H/s |");
    local_30 = 0;
    std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::begin
              ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_60.m_timestamps =
         (uint64_t **)
         std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::end
                   ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
                               *)in_stack_ffffffffffffff00,
                              (__normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
                               *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
          bVar2) {
      local_60.m_counts =
           (uint64_t **)
           __gnu_cxx::
           __normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
           ::operator*((__normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
                        *)&stack0xffffffffffffffc0);
      iVar1 = ((reference)local_60.m_counts)->affinity;
      (**(code **)(*in_RDI + 0x20))();
      Hashrate::calc(in_stack_ffffffffffffff68,
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (size_t)in_stack_ffffffffffffff58);
      pcVar6 = Hashrate::format((double)in_stack_ffffffffffffff00,
                                (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                ),0x20a7fc);
      (**(code **)(*in_RDI + 0x20))();
      Hashrate::calc(in_stack_ffffffffffffff68,
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (size_t)in_stack_ffffffffffffff58);
      pcVar4 = Hashrate::format((double)in_stack_ffffffffffffff00,
                                (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                ),0x20a839);
      (**(code **)(*in_RDI + 0x20))();
      Hashrate::calc(in_stack_ffffffffffffff68,
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (size_t)in_stack_ffffffffffffff58);
      pcVar5 = (char *)0x8;
      in_stack_ffffffffffffff58 =
           (OclDevice *)
           Hashrate::format((double)in_stack_ffffffffffffff00,
                            (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                            0x20a876);
      pcVar5 = OclDevice::index((OclDevice *)((long)local_60.m_counts + 0x20),pcVar5,__c);
      in_stack_fffffffffffffef8 = SUB84(pcVar5,0);
      OclDevice::topology((OclDevice *)((long)local_60.m_counts + 0x20));
      in_stack_ffffffffffffff68 = &local_60;
      PciTopology::toString(in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff00 = (String *)String::data((String *)in_stack_ffffffffffffff68);
      OclDevice::printableName(in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff28 = (PciTopology *)String::data(local_80);
      in_stack_ffffffffffffff64 = in_stack_fffffffffffffef8;
      Log::print("| %8zu | %8ld | %7s | %7s | %7s |\x1b[1;36m #%u\x1b[0m\x1b[0;33m %s\x1b[0m %s",
                 local_30,iVar1,pcVar6,pcVar4,in_stack_ffffffffffffff58,in_stack_fffffffffffffef8,
                 in_stack_ffffffffffffff00,in_stack_ffffffffffffff28);
      String::~String(in_stack_ffffffffffffff00);
      String::~String(in_stack_ffffffffffffff00);
      local_30 = local_30 + 1;
      __gnu_cxx::
      __normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
      ::operator++((__normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
                    *)&stack0xffffffffffffffc0);
    }
    (**(code **)(*in_RDI + 0x20))();
    Hashrate::calc(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    pcVar5 = Hashrate::format((double)in_stack_ffffffffffffff00,
                              (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                              0x20a9f0);
    (**(code **)(*in_RDI + 0x20))();
    Hashrate::calc(in_stack_ffffffffffffff20,(size_t)pcVar5);
    this_00 = (Hashrate *)
              Hashrate::format((double)in_stack_ffffffffffffff00,
                               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                               ,0x20aa26);
    (**(code **)(*in_RDI + 0x20))();
    Hashrate::calc(this_00,(size_t)pcVar5);
    pcVar6 = Hashrate::format((double)in_stack_ffffffffffffff00,
                              (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                              0x20aa5c);
    Log::print("\x1b[1;37m|        - |        - | %7s | %7s | %7s |",pcVar5,this_00,pcVar6);
  }
  return;
}

Assistant:

void xmrig::OclBackend::printHashrate(bool details)
{
    if (!details || !hashrate()) {
        return;
    }

    char num[8 * 3] = { 0 };

    Log::print(WHITE_BOLD_S "| OPENCL # | AFFINITY | 10s H/s | 60s H/s | 15m H/s |");

    size_t i = 0;
    for (const auto &data : d_ptr->threads) {
         Log::print("| %8zu | %8" PRId64 " | %7s | %7s | %7s |" CYAN_BOLD(" #%u") YELLOW(" %s") " %s",
                    i,
                    data.affinity,
                    Hashrate::format(hashrate()->calc(i, Hashrate::ShortInterval),  num,         sizeof num / 3),
                    Hashrate::format(hashrate()->calc(i, Hashrate::MediumInterval), num + 8,     sizeof num / 3),
                    Hashrate::format(hashrate()->calc(i, Hashrate::LargeInterval),  num + 8 * 2, sizeof num / 3),
                    data.device.index(),
                    data.device.topology().toString().data(),
                    data.device.printableName().data()
                    );

         i++;
    }

    Log::print(WHITE_BOLD_S "|        - |        - | %7s | %7s | %7s |",
               Hashrate::format(hashrate()->calc(Hashrate::ShortInterval),  num,         sizeof num / 3),
               Hashrate::format(hashrate()->calc(Hashrate::MediumInterval), num + 8,     sizeof num / 3),
               Hashrate::format(hashrate()->calc(Hashrate::LargeInterval),  num + 8 * 2, sizeof num / 3)
               );
}